

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::AccessChainTraverser::visitSymbol(AccessChainTraverser *this,TIntermSymbol *symbol)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x140))
                    ((long *)CONCAT44(extraout_var,iVar2));
  if (cVar1 != '\0') {
    iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(symbol);
    this->topLevelStorageQualifier =
         *(TStorageQualifier *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0x7f;
  }
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var_01,iVar2),0,5,"anon@");
  if (iVar2 != 0) {
    iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(&this->path,*(char **)(CONCAT44(extraout_var_02,iVar2) + 8),
              *(size_type *)(CONCAT44(extraout_var_02,iVar2) + 0x10));
    return;
  }
  return;
}

Assistant:

void visitSymbol(TIntermSymbol* symbol) override {
        if (symbol->getType().isOpaque())
            topLevelStorageQualifier = symbol->getQualifier().storage;
        if (!IsAnonymous(symbol->getName()))
            path.append(symbol->getName());
    }